

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O2

void __thiscall
CurrentGenerator::CurrentGenerator(CurrentGenerator *this,CurrentGenerator_param *param)

{
  double dVar1;
  Clock *pCVar2;
  Logging *pLVar3;
  ulong uVar4;
  int iVar5;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00130ae8;
  this->param = param;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar2 = Clock::getInstance();
  this->clock = pCVar2;
  pLVar3 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar3;
  uVar4 = std::chrono::_V2::system_clock::now();
  iVar5 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
  (this->generator)._M_x = (ulong)(iVar5 + (uint)(iVar5 == 0));
  dVar1 = param->noiseStd;
  (this->distribution)._M_param._M_mean = param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

CurrentGenerator::CurrentGenerator(CurrentGenerator_param* param) : param(param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(seed);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}